

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Quaternion QuaternionNlerp(Quaternion q1,Quaternion q2,float amount)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Quaternion QVar7;
  
  fVar2 = q1.x + amount * (q2.x - q1.x);
  fVar3 = q1.y + amount * (q2.y - q1.y);
  fVar4 = q1.z + amount * (q2.z - q1.z);
  fVar5 = q1.w + amount * (q2.w - q1.w);
  fVar6 = SQRT(fVar5 * fVar5 + fVar4 * fVar4 + fVar2 * fVar2 + fVar3 * fVar3);
  uVar1 = -(uint)(fVar6 == 0.0);
  fVar6 = (float)(uVar1 & 0x3f800000 | ~uVar1 & (uint)(1.0 / fVar6));
  QVar7.x = fVar2 * fVar6;
  QVar7.y = fVar3 * fVar6;
  QVar7.w = fVar5 * fVar6;
  QVar7.z = fVar4 * fVar6;
  return QVar7;
}

Assistant:

RMAPI Quaternion QuaternionNlerp(Quaternion q1, Quaternion q2, float amount)
{
    Quaternion result = { 0 };

    // QuaternionLerp(q1, q2, amount)
    result.x = q1.x + amount*(q2.x - q1.x);
    result.y = q1.y + amount*(q2.y - q1.y);
    result.z = q1.z + amount*(q2.z - q1.z);
    result.w = q1.w + amount*(q2.w - q1.w);

    // QuaternionNormalize(q);
    Quaternion q = result;
    float length = sqrtf(q.x*q.x + q.y*q.y + q.z*q.z + q.w*q.w);
    if (length == 0.0f) length = 1.0f;
    float ilength = 1.0f/length;

    result.x = q.x*ilength;
    result.y = q.y*ilength;
    result.z = q.z*ilength;
    result.w = q.w*ilength;

    return result;
}